

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_proxy_call_constructor
                  (JSContext *ctx,JSValue func_obj,JSValue new_target,int argc,JSValue *argv)

{
  JSValue func_obj_00;
  int iVar1;
  JSProxyData *pJVar2;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  JSValue args [3];
  JSValue ret;
  JSValue arg_array;
  JSValue method;
  JSProxyData *s;
  JSContext *in_stack_ffffffffffffff10;
  JSValue in_stack_ffffffffffffff18;
  JSValue in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  JSContext *in_stack_ffffffffffffff40;
  JSValue *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff5c;
  JSContext *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  JSValue *in_stack_ffffffffffffff70;
  JSContext *in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  int64_t local_70;
  JSValue local_58;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar3.tag = in_stack_ffffffffffffff88;
  JVar3.u.float64 = in_stack_ffffffffffffff80.float64;
  pJVar2 = get_proxy_method(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,JVar3,
                            (JSAtom)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  if (pJVar2 == (JSProxyData *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    iVar1 = JS_IsConstructor(in_RDI,pJVar2->target);
    if (iVar1 == 0) {
      _local_10 = JS_ThrowTypeError(in_RDI,"not a constructor");
    }
    else {
      iVar1 = JS_IsUndefined(local_58);
      if (iVar1 == 0) {
        JVar3 = js_create_array(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                in_stack_ffffffffffffff48);
        iVar1 = JS_IsException(JVar3);
        if (iVar1 == 0) {
          JVar3 = JS_Call(in_stack_ffffffffffffff40,pJVar2->target,JVar3,in_stack_ffffffffffffff3c,
                          in_R8);
          local_10 = JVar3.u;
          local_70 = JVar3.tag;
          iVar1 = JS_IsException(JVar3);
          if ((iVar1 == 0) && ((int)JVar3.tag != -1)) {
            JS_FreeValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
            in_stack_ffffffffffffff18 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x17d84c);
            local_10 = in_stack_ffffffffffffff18.u;
            local_70 = in_stack_ffffffffffffff18.tag;
          }
        }
        else {
          local_10.ptr = (void *)((ulong)in_stack_ffffffffffffff3c << 0x20);
          local_70 = 6;
        }
        JS_FreeValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
        JS_FreeValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
        local_8 = local_70;
      }
      else {
        func_obj_00.u._4_4_ = in_stack_ffffffffffffff3c;
        func_obj_00.u.int32 = in_stack_ffffffffffffff38;
        func_obj_00.tag = (int64_t)in_stack_ffffffffffffff40;
        _local_10 = JS_CallConstructor2((JSContext *)in_stack_ffffffffffffff18.tag,func_obj_00,
                                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff18.u._4_4_,
                                        (JSValue *)in_stack_ffffffffffffff60);
      }
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_proxy_call_constructor(JSContext *ctx, JSValueConst func_obj,
                                         JSValueConst new_target,
                                         int argc, JSValueConst *argv)
{
    JSProxyData *s;
    JSValue method, arg_array, ret;
    JSValueConst args[3];

    s = get_proxy_method(ctx, &method, func_obj, JS_ATOM_construct);
    if (!s)
        return JS_EXCEPTION;
    if (!JS_IsConstructor(ctx, s->target))
        return JS_ThrowTypeError(ctx, "not a constructor");
    if (JS_IsUndefined(method))
        return JS_CallConstructor2(ctx, s->target, new_target, argc, argv);
    arg_array = js_create_array(ctx, argc, argv);
    if (JS_IsException(arg_array)) {
        ret = JS_EXCEPTION;
        goto fail;
    }
    args[0] = s->target;
    args[1] = arg_array;
    args[2] = new_target;
    ret = JS_Call(ctx, method, s->handler, 3, args);
    if (!JS_IsException(ret) && JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
        JS_FreeValue(ctx, ret);
        ret = JS_ThrowTypeErrorNotAnObject(ctx);
    }
 fail:
    JS_FreeValue(ctx, method);
    JS_FreeValue(ctx, arg_array);
    return ret;
}